

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubVerify.cpp
# Opt level: O0

void SubVerifyBase<unsigned_char,int>(char *types)

{
  bool bVar1;
  char *pcVar2;
  TestCase<unsigned_char,_int,_4> TVar3;
  string msg_2;
  uchar x;
  string msg_1;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> si;
  bool fSuccess;
  string msg;
  uchar ret;
  TestCase<unsigned_char,_int,_4> test;
  TestVector<unsigned_char,_int,_4> tests;
  uchar *in_stack_fffffffffffffda8;
  allocator *in_stack_fffffffffffffdb0;
  allocator *in_stack_fffffffffffffdb8;
  TestVector<unsigned_char,_int,_4> *in_stack_fffffffffffffdc0;
  allocator local_1e1;
  string local_1e0 [23];
  undefined1 in_stack_fffffffffffffe37;
  int in_stack_fffffffffffffe38;
  uchar in_stack_fffffffffffffe3f;
  string *in_stack_fffffffffffffe40;
  string local_1b8 [32];
  string local_198 [32];
  string local_178 [32];
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> local_158;
  uchar local_152;
  allocator local_151;
  string local_150 [39];
  allocator local_129;
  string local_128 [32];
  string local_108 [32];
  string local_e8 [37];
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  local_c3;
  byte local_c2;
  allocator local_c1;
  string local_c0 [55];
  allocator local_89;
  string local_88 [32];
  string local_68 [40];
  undefined8 local_40;
  undefined1 local_38;
  undefined8 local_2c;
  byte local_24;
  TestVector<unsigned_char,_int,_4> local_20;
  
  TestVector<unsigned_char,_int,_4>::TestVector(&local_20);
  TVar3 = TestVector<unsigned_char,_int,_4>::GetNext(in_stack_fffffffffffffdc0);
  local_40 = TVar3._0_8_;
  local_38 = TVar3.fExpected;
  local_2c = local_40;
  local_24 = local_38;
  while( true ) {
    bVar1 = TestVector<unsigned_char,_int,_4>::Done(&local_20);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    bVar1 = SafeSubtract<unsigned_char,int>
                      ((uchar)((ulong)in_stack_fffffffffffffdb0 >> 0x38),
                       (int)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
    if (bVar1 != (bool)(local_24 & 1)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_88,"Error in case ",&local_89);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffdb8,(char *)in_stack_fffffffffffffdb0);
      std::__cxx11::string::~string(local_88);
      std::allocator<char>::~allocator((allocator<char> *)&local_89);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_c0,pcVar2,&local_c1);
      err_msg<unsigned_char,int>
                (in_stack_fffffffffffffe40,in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38,
                 (bool)in_stack_fffffffffffffe37);
      std::__cxx11::string::~string(local_c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_c1);
      std::__cxx11::string::~string(local_68);
    }
    local_c2 = 1;
    SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
    SafeInt(&local_c3,(uchar *)&local_2c);
    SafeInt<unsigned_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
    operator-=((SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                *)in_stack_fffffffffffffdb0,(int)((ulong)in_stack_fffffffffffffda8 >> 0x20));
    if ((local_c2 & 1) != (local_24 & 1)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_128,"Error in case ",&local_129);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffdb8,(char *)in_stack_fffffffffffffdb0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffdb8,(char *)in_stack_fffffffffffffdb0);
      std::__cxx11::string::~string(local_108);
      std::__cxx11::string::~string(local_128);
      std::allocator<char>::~allocator((allocator<char> *)&local_129);
      in_stack_fffffffffffffdc0 = (TestVector<unsigned_char,_int,_4> *)std::__cxx11::string::c_str()
      ;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_150,(char *)in_stack_fffffffffffffdc0,&local_151);
      err_msg<unsigned_char,int>
                (in_stack_fffffffffffffe40,in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38,
                 (bool)in_stack_fffffffffffffe37);
      std::__cxx11::string::~string(local_150);
      std::allocator<char>::~allocator((allocator<char> *)&local_151);
      std::__cxx11::string::~string(local_e8);
    }
    local_c2 = 1;
    local_152 = (uchar)local_2c;
    SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::SafeInt
              (&local_158,(int *)((long)&local_2c + 4));
    operator-=((uchar *)in_stack_fffffffffffffdb8,
               (SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
               )(int)((ulong)in_stack_fffffffffffffdc0 >> 0x20));
    if ((local_c2 & 1) != (local_24 & 1)) {
      in_stack_fffffffffffffdb8 = (allocator *)&stack0xfffffffffffffe47;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1b8,"Error in case ",in_stack_fffffffffffffdb8);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffdb8,(char *)in_stack_fffffffffffffdb0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffdb8,(char *)in_stack_fffffffffffffdb0);
      std::__cxx11::string::~string(local_198);
      std::__cxx11::string::~string(local_1b8);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe47);
      in_stack_fffffffffffffda8 = (uchar *)std::__cxx11::string::c_str();
      in_stack_fffffffffffffdb0 = &local_1e1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_1e0,(char *)in_stack_fffffffffffffda8,in_stack_fffffffffffffdb0);
      err_msg<unsigned_char,int>
                (in_stack_fffffffffffffe40,in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38,
                 (bool)in_stack_fffffffffffffe37);
      std::__cxx11::string::~string(local_1e0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
      std::__cxx11::string::~string(local_178);
    }
    TVar3 = TestVector<unsigned_char,_int,_4>::GetNext(in_stack_fffffffffffffdc0);
    local_2c = TVar3._0_8_;
    local_24 = TVar3.fExpected;
  }
  return;
}

Assistant:

void SubVerifyBase(const char* types)
{
    TestVector< T, U, OpType::Sub > tests;
    TestCase< T, U, OpType::Sub > test = tests.GetNext();

    while (!tests.Done())
    {
        T ret;
        if (SafeSubtract(test.x, test.y, ret) != test.fExpected)
        {
            std::string msg = std::string("Error in case ") + types;
            err_msg(msg.c_str(), test.x, test.y, test.fExpected);
        }

        // Now test throwing version
        bool fSuccess = true;
        try
        {
            SafeInt<T> si(test.x);
            si -= test.y;
        }
        catch (...)
        {
            fSuccess = false;
        }

        if (fSuccess != test.fExpected)
        {
            std::string msg = std::string("Error in case ") + types + " throw (1): ";
            err_msg(msg.c_str(), test.x, test.y, test.fExpected);
        }

        // Also need to test the version that assigns back out
        // to a plain int, as it has different logic
        fSuccess = true;
        try
        {
            T x(test.x);
            x -= SafeInt<U>(test.y);
        }
        catch (...)
        {
            fSuccess = false;
        }

        if (fSuccess != test.fExpected)
        {
            std::string msg = std::string("Error in case ") + types + " throw (2): ";
            err_msg(msg.c_str(), test.x, test.y, test.fExpected);
        }

        test = tests.GetNext();
    }
}